

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Frodo_KEM.h
# Opt level: O0

void Hacl_Impl_Frodo_Params_frodo_gen_matrix
               (Spec_Frodo_Params_frodo_gen_a a,uint32_t n,uint8_t *seed,uint16_t *a_matrix)

{
  uint16_t *a_matrix_local;
  uint8_t *seed_local;
  uint32_t n_local;
  Spec_Frodo_Params_frodo_gen_a a_local;
  
  if (a == '\0') {
    Hacl_Impl_Frodo_Gen_frodo_gen_matrix_shake_4x(n,seed,a_matrix);
    return;
  }
  fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/include/internal/Hacl_Frodo_KEM.h"
          ,0x107);
  exit(0xfd);
}

Assistant:

static inline void
Hacl_Impl_Frodo_Params_frodo_gen_matrix(
  Spec_Frodo_Params_frodo_gen_a a,
  uint32_t n,
  uint8_t *seed,
  uint16_t *a_matrix
)
{
  switch (a)
  {
    case Spec_Frodo_Params_SHAKE128:
      {
        Hacl_Impl_Frodo_Gen_frodo_gen_matrix_shake_4x(n, seed, a_matrix);
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}